

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O0

long oggpack_look(oggpack_buffer *b,int bits)

{
  int iVar1;
  uint uVar2;
  ogg_reference *local_48;
  ogg_reference *head;
  uchar *ptr;
  ulong uStack_30;
  int end;
  unsigned_long ret;
  unsigned_long m;
  int bits_local;
  oggpack_buffer *b_local;
  
  uStack_30 = 0xffffffffffffffff;
  iVar1 = b->headbit + bits;
  if ((long)iVar1 < b->headend * 8) {
    uVar2 = (int)(uint)*b->headptr >> ((byte)b->headbit & 0x1f);
    uStack_30 = (ulong)(int)uVar2;
    if (8 < iVar1) {
      uVar2 = (uint)b->headptr[1] << (8U - (char)b->headbit & 0x1f) | uVar2;
      uStack_30 = (ulong)(int)uVar2;
      if (0x10 < iVar1) {
        uVar2 = (uint)b->headptr[2] << (0x10U - (char)b->headbit & 0x1f) | uVar2;
        uStack_30 = (ulong)(int)uVar2;
        if (0x18 < iVar1) {
          uVar2 = (uint)b->headptr[3] << (0x18U - (char)b->headbit & 0x1f) | uVar2;
          uStack_30 = (ulong)(int)uVar2;
          if ((0x20 < iVar1) && (b->headbit != 0)) {
            uStack_30 = (ulong)(int)((uint)b->headptr[4] << (0x20U - (char)b->headbit & 0x1f) |
                                    uVar2);
          }
        }
      }
    }
  }
  else {
    ptr._4_4_ = (int)b->headend;
    head = (ogg_reference *)b->headptr;
    local_48 = b->head;
    if (ptr._4_4_ < 0) {
      return -1;
    }
    if (iVar1 != 0) {
      while (ptr._4_4_ == 0) {
        local_48 = local_48->next;
        if (local_48 == (ogg_reference *)0x0) {
          return -1;
        }
        head = (ogg_reference *)(local_48->buffer->data + local_48->begin);
        ptr._4_4_ = (int)local_48->length;
      }
      uVar2 = (int)(uint)*(byte *)&head->buffer >> ((byte)b->headbit & 0x1f);
      uStack_30 = (ulong)(int)uVar2;
      if (8 < iVar1) {
        ptr._4_4_ = ptr._4_4_ + -1;
        head = (ogg_reference *)((long)&head->buffer + 1);
        while (ptr._4_4_ == 0) {
          local_48 = local_48->next;
          if (local_48 == (ogg_reference *)0x0) {
            return -1;
          }
          head = (ogg_reference *)(local_48->buffer->data + local_48->begin);
          ptr._4_4_ = (int)local_48->length;
        }
        uVar2 = (uint)*(byte *)&head->buffer << (8U - (char)b->headbit & 0x1f) | uVar2;
        uStack_30 = (ulong)(int)uVar2;
        if (0x10 < iVar1) {
          ptr._4_4_ = ptr._4_4_ + -1;
          head = (ogg_reference *)((long)&head->buffer + 1);
          while (ptr._4_4_ == 0) {
            local_48 = local_48->next;
            if (local_48 == (ogg_reference *)0x0) {
              return -1;
            }
            head = (ogg_reference *)(local_48->buffer->data + local_48->begin);
            ptr._4_4_ = (int)local_48->length;
          }
          uVar2 = (uint)*(byte *)&head->buffer << (0x10U - (char)b->headbit & 0x1f) | uVar2;
          uStack_30 = (ulong)(int)uVar2;
          if (0x18 < iVar1) {
            ptr._4_4_ = ptr._4_4_ + -1;
            head = (ogg_reference *)((long)&head->buffer + 1);
            while (ptr._4_4_ == 0) {
              local_48 = local_48->next;
              if (local_48 == (ogg_reference *)0x0) {
                return -1;
              }
              head = (ogg_reference *)(local_48->buffer->data + local_48->begin);
              ptr._4_4_ = (int)local_48->length;
            }
            uVar2 = (uint)*(byte *)&head->buffer << (0x18U - (char)b->headbit & 0x1f) | uVar2;
            uStack_30 = (ulong)(int)uVar2;
            if ((0x20 < iVar1) && (b->headbit != 0)) {
              ptr._4_4_ = ptr._4_4_ + -1;
              head = (ogg_reference *)((long)&head->buffer + 1);
              while (ptr._4_4_ == 0) {
                local_48 = local_48->next;
                if (local_48 == (ogg_reference *)0x0) {
                  return -1;
                }
                head = (ogg_reference *)(local_48->buffer->data + local_48->begin);
                ptr._4_4_ = (int)local_48->length;
              }
              uStack_30 = (ulong)(int)((uint)*(byte *)&head->buffer <<
                                       (0x20U - (char)b->headbit & 0x1f) | uVar2);
            }
          }
        }
      }
    }
  }
  return mask[bits] & uStack_30;
}

Assistant:

long oggpack_look(oggpack_buffer *b,int bits){
  unsigned long m=mask[bits];
  unsigned long ret=-1;

  bits+=b->headbit;

  if(bits >= b->headend<<3){
    int            end=b->headend;
    unsigned char *ptr=b->headptr;
    ogg_reference *head=b->head;

    if(end<0)return -1;
    
    if(bits){
      _lookspan();
      ret=*ptr++>>b->headbit;
      if(bits>8){
        --end;
        _lookspan();
        ret|=*ptr++<<(8-b->headbit);  
        if(bits>16){
          --end;
          _lookspan();
          ret|=*ptr++<<(16-b->headbit);  
          if(bits>24){
            --end;
            _lookspan();
            ret|=*ptr++<<(24-b->headbit);  
            if(bits>32 && b->headbit){
              --end;
              _lookspan();
              ret|=*ptr<<(32-b->headbit);
            }
          }
        }
      }
    }

  }else{

    /* make this a switch jump-table */
    ret=b->headptr[0]>>b->headbit;
    if(bits>8){
      ret|=b->headptr[1]<<(8-b->headbit);  
      if(bits>16){
        ret|=b->headptr[2]<<(16-b->headbit);  
        if(bits>24){
          ret|=b->headptr[3]<<(24-b->headbit);  
          if(bits>32 && b->headbit)
            ret|=b->headptr[4]<<(32-b->headbit);
        }
      }
    }
  }

  ret&=m;
  return ret;
}